

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  uint uVar2;
  BVH *bvh;
  Geometry *pGVar3;
  RTCRayQueryContext *pRVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  size_t k;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [28];
  int iVar30;
  byte bVar31;
  byte bVar32;
  ulong *puVar33;
  byte bVar34;
  long lVar35;
  undefined4 uVar36;
  ulong uVar37;
  NodeRef root;
  ulong uVar38;
  ulong uVar39;
  undefined1 (*pauVar40) [32];
  bool bVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar66;
  float fVar67;
  undefined1 auVar68 [64];
  undefined1 auVar70 [36];
  undefined1 auVar69 [64];
  undefined1 extraout_var [36];
  undefined1 extraout_var_00 [36];
  float fVar72;
  undefined1 auVar73 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar75 [36];
  undefined1 auVar74 [64];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar77 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  uint uVar102;
  uint uVar103;
  uint uVar104;
  uint uVar105;
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar115 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  byte local_2b8c;
  Precalculations local_2b51;
  Geometry *local_2b50;
  RayK<8> *local_2b48;
  ulong local_2b40;
  undefined1 (*local_2b38) [32];
  RTCFilterFunctionNArguments local_2b30;
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  ulong local_2a98;
  undefined8 local_2a90;
  undefined8 uStack_2a88;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  float local_2980;
  float fStack_297c;
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  int iStack_2964;
  RTCHitN local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  uint local_2880;
  uint uStack_287c;
  uint uStack_2878;
  uint uStack_2874;
  uint uStack_2870;
  uint uStack_286c;
  uint uStack_2868;
  uint uStack_2864;
  uint local_2860;
  uint uStack_285c;
  uint uStack_2858;
  uint uStack_2854;
  uint uStack_2850;
  uint uStack_284c;
  uint uStack_2848;
  uint uStack_2844;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2840;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  undefined1 local_26e0 [32];
  int local_26c0;
  int iStack_26bc;
  int iStack_26b8;
  int iStack_26b4;
  int iStack_26b0;
  int iStack_26ac;
  int iStack_26a8;
  int iStack_26a4;
  uint local_26a0;
  uint uStack_269c;
  uint uStack_2698;
  uint uStack_2694;
  uint uStack_2690;
  uint uStack_268c;
  uint uStack_2688;
  uint uStack_2684;
  uint local_2680;
  uint uStack_267c;
  uint uStack_2678;
  uint uStack_2674;
  uint uStack_2670;
  uint uStack_266c;
  uint uStack_2668;
  uint uStack_2664;
  uint local_2660;
  uint uStack_265c;
  uint uStack_2658;
  uint uStack_2654;
  uint uStack_2650;
  uint uStack_264c;
  uint uStack_2648;
  uint uStack_2644;
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  uint local_1e60;
  uint uStack_1e5c;
  uint uStack_1e58;
  uint uStack_1e54;
  uint uStack_1e50;
  uint uStack_1e4c;
  uint uStack_1e48;
  uint uStack_1e44;
  undefined1 local_1e40 [7696];
  undefined1 auVar71 [36];
  undefined1 auVar76 [36];
  undefined1 auVar94 [32];
  undefined1 auVar99 [32];
  
  bvh = (BVH *)This->ptr;
  local_2608 = (bvh->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar46 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar43 = ZEXT816(0) << 0x40;
      uVar42 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar43),5);
      uVar38 = vpcmpeqd_avx512vl(auVar46,(undefined1  [32])valid_i->field_0);
      uVar42 = uVar42 & uVar38;
      local_2b8c = (byte)uVar42;
      if (local_2b8c != 0) {
        local_2840._0_4_ = *(undefined4 *)ray;
        local_2840._4_4_ = *(undefined4 *)(ray + 4);
        local_2840._8_4_ = *(undefined4 *)(ray + 8);
        local_2840._12_4_ = *(undefined4 *)(ray + 0xc);
        local_2840._16_4_ = *(undefined4 *)(ray + 0x10);
        local_2840._20_4_ = *(undefined4 *)(ray + 0x14);
        local_2840._24_4_ = *(undefined4 *)(ray + 0x18);
        local_2840._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_2840._32_4_ = *(undefined4 *)(ray + 0x20);
        local_2840._36_4_ = *(undefined4 *)(ray + 0x24);
        local_2840._40_4_ = *(undefined4 *)(ray + 0x28);
        local_2840._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_2840._48_4_ = *(undefined4 *)(ray + 0x30);
        local_2840._52_4_ = *(undefined4 *)(ray + 0x34);
        local_2840._56_4_ = *(undefined4 *)(ray + 0x38);
        local_2840._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_2840._64_4_ = *(undefined4 *)(ray + 0x40);
        local_2840._68_4_ = *(undefined4 *)(ray + 0x44);
        local_2840._72_4_ = *(undefined4 *)(ray + 0x48);
        local_2840._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_2840._80_4_ = *(undefined4 *)(ray + 0x50);
        local_2840._84_4_ = *(undefined4 *)(ray + 0x54);
        local_2840._88_4_ = *(undefined4 *)(ray + 0x58);
        local_2840._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_27e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_27c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_27a0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar111 = ZEXT3264(auVar46);
        vandps_avx512vl(local_27e0,auVar46);
        auVar47._8_4_ = 0x219392ef;
        auVar47._0_8_ = 0x219392ef219392ef;
        auVar47._12_4_ = 0x219392ef;
        auVar47._16_4_ = 0x219392ef;
        auVar47._20_4_ = 0x219392ef;
        auVar47._24_4_ = 0x219392ef;
        auVar47._28_4_ = 0x219392ef;
        uVar38 = vcmpps_avx512vl(auVar46,auVar47,1);
        bVar41 = (bool)((byte)uVar38 & 1);
        auVar48._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27e0._0_4_;
        bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27e0._4_4_;
        bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27e0._8_4_;
        bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27e0._12_4_;
        bVar41 = (bool)((byte)(uVar38 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27e0._16_4_;
        bVar41 = (bool)((byte)(uVar38 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27e0._20_4_;
        bVar41 = (bool)((byte)(uVar38 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27e0._24_4_;
        bVar41 = SUB81(uVar38 >> 7,0);
        auVar48._28_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27e0._28_4_;
        vandps_avx512vl(local_27c0,auVar46);
        uVar38 = vcmpps_avx512vl(auVar48,auVar47,1);
        bVar41 = (bool)((byte)uVar38 & 1);
        auVar51._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27c0._0_4_;
        bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27c0._4_4_;
        bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27c0._8_4_;
        bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27c0._12_4_;
        bVar41 = (bool)((byte)(uVar38 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27c0._16_4_;
        bVar41 = (bool)((byte)(uVar38 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27c0._20_4_;
        bVar41 = (bool)((byte)(uVar38 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27c0._24_4_;
        bVar41 = SUB81(uVar38 >> 7,0);
        auVar51._28_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27c0._28_4_;
        vandps_avx512vl(local_27a0,auVar46);
        uVar38 = vcmpps_avx512vl(auVar51,auVar47,1);
        bVar41 = (bool)((byte)uVar38 & 1);
        auVar46._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27a0._0_4_;
        bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27a0._4_4_;
        bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27a0._8_4_;
        bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27a0._12_4_;
        bVar41 = (bool)((byte)(uVar38 >> 4) & 1);
        auVar46._16_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27a0._16_4_;
        bVar41 = (bool)((byte)(uVar38 >> 5) & 1);
        auVar46._20_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27a0._20_4_;
        bVar41 = (bool)((byte)(uVar38 >> 6) & 1);
        auVar46._24_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27a0._24_4_;
        bVar41 = SUB81(uVar38 >> 7,0);
        auVar46._28_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * local_27a0._28_4_;
        auVar49._8_4_ = 0x3f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._12_4_ = 0x3f800000;
        auVar49._16_4_ = 0x3f800000;
        auVar49._20_4_ = 0x3f800000;
        auVar49._24_4_ = 0x3f800000;
        auVar49._28_4_ = 0x3f800000;
        auVar47 = vrcp14ps_avx512vl(auVar48);
        auVar44 = vfnmadd213ps_fma(auVar48,auVar47,auVar49);
        auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar47,auVar47);
        auVar48 = vrcp14ps_avx512vl(auVar51);
        auVar45 = vfnmadd213ps_fma(auVar51,auVar48,auVar49);
        auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar48,auVar48);
        auVar48 = vrcp14ps_avx512vl(auVar46);
        auVar92 = vfnmadd213ps_fma(auVar46,auVar48,auVar49);
        local_2780 = ZEXT1632(auVar44);
        local_2760 = ZEXT1632(auVar45);
        auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar48,auVar48);
        local_2740 = ZEXT1632(auVar92);
        local_2720 = (float)local_2840._0_4_ * auVar44._0_4_;
        fStack_271c = (float)local_2840._4_4_ * auVar44._4_4_;
        fStack_2718 = (float)local_2840._8_4_ * auVar44._8_4_;
        fStack_2714 = (float)local_2840._12_4_ * auVar44._12_4_;
        fStack_2710 = (float)local_2840._16_4_ * 0.0;
        fStack_270c = (float)local_2840._20_4_ * 0.0;
        fStack_2708 = (float)local_2840._24_4_ * 0.0;
        local_2700 = (float)local_2840._32_4_ * auVar45._0_4_;
        fStack_26fc = (float)local_2840._36_4_ * auVar45._4_4_;
        fStack_26f8 = (float)local_2840._40_4_ * auVar45._8_4_;
        fStack_26f4 = (float)local_2840._44_4_ * auVar45._12_4_;
        fStack_26f0 = (float)local_2840._48_4_ * 0.0;
        fStack_26ec = (float)local_2840._52_4_ * 0.0;
        fStack_26e8 = (float)local_2840._56_4_ * 0.0;
        local_26e0._4_4_ = (float)local_2840._68_4_ * auVar92._4_4_;
        local_26e0._0_4_ = (float)local_2840._64_4_ * auVar92._0_4_;
        local_26e0._8_4_ = (float)local_2840._72_4_ * auVar92._8_4_;
        local_26e0._12_4_ = (float)local_2840._76_4_ * auVar92._12_4_;
        local_26e0._16_4_ = (float)local_2840._80_4_ * 0.0;
        local_26e0._20_4_ = (float)local_2840._84_4_ * 0.0;
        local_26e0._24_4_ = (float)local_2840._88_4_ * 0.0;
        local_26e0._28_4_ = local_2840._92_4_;
        uVar38 = vcmpps_avx512vl(ZEXT1632(auVar44),ZEXT1632(auVar43),1);
        auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_26c0 = (uint)((byte)uVar38 & 1) * auVar46._0_4_;
        iStack_26bc = (uint)((byte)(uVar38 >> 1) & 1) * auVar46._4_4_;
        iStack_26b8 = (uint)((byte)(uVar38 >> 2) & 1) * auVar46._8_4_;
        iStack_26b4 = (uint)((byte)(uVar38 >> 3) & 1) * auVar46._12_4_;
        iStack_26b0 = (uint)((byte)(uVar38 >> 4) & 1) * auVar46._16_4_;
        iStack_26ac = (uint)((byte)(uVar38 >> 5) & 1) * auVar46._20_4_;
        iStack_26a8 = (uint)((byte)(uVar38 >> 6) & 1) * auVar46._24_4_;
        iStack_26a4 = (uint)(byte)(uVar38 >> 7) * auVar46._28_4_;
        auVar48 = ZEXT1632(auVar43);
        uVar38 = vcmpps_avx512vl(ZEXT1632(auVar45),auVar48,5);
        auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar41 = (bool)((byte)uVar38 & 1);
        local_26a0 = (uint)bVar41 * auVar46._0_4_ | (uint)!bVar41 * 0x30;
        bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
        uStack_269c = (uint)bVar41 * auVar46._4_4_ | (uint)!bVar41 * 0x30;
        bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
        uStack_2698 = (uint)bVar41 * auVar46._8_4_ | (uint)!bVar41 * 0x30;
        bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
        uStack_2694 = (uint)bVar41 * auVar46._12_4_ | (uint)!bVar41 * 0x30;
        bVar41 = (bool)((byte)(uVar38 >> 4) & 1);
        uStack_2690 = (uint)bVar41 * auVar46._16_4_ | (uint)!bVar41 * 0x30;
        bVar41 = (bool)((byte)(uVar38 >> 5) & 1);
        uStack_268c = (uint)bVar41 * auVar46._20_4_ | (uint)!bVar41 * 0x30;
        bVar41 = (bool)((byte)(uVar38 >> 6) & 1);
        uStack_2688 = (uint)bVar41 * auVar46._24_4_ | (uint)!bVar41 * 0x30;
        bVar41 = SUB81(uVar38 >> 7,0);
        uStack_2684 = (uint)bVar41 * auVar46._28_4_ | (uint)!bVar41 * 0x30;
        uVar38 = vcmpps_avx512vl(ZEXT1632(auVar92),auVar48,5);
        auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar41 = (bool)((byte)uVar38 & 1);
        local_2680 = (uint)bVar41 * auVar46._0_4_ | (uint)!bVar41 * 0x50;
        bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
        uStack_267c = (uint)bVar41 * auVar46._4_4_ | (uint)!bVar41 * 0x50;
        bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
        uStack_2678 = (uint)bVar41 * auVar46._8_4_ | (uint)!bVar41 * 0x50;
        bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
        uStack_2674 = (uint)bVar41 * auVar46._12_4_ | (uint)!bVar41 * 0x50;
        bVar41 = (bool)((byte)(uVar38 >> 4) & 1);
        uStack_2670 = (uint)bVar41 * auVar46._16_4_ | (uint)!bVar41 * 0x50;
        bVar41 = (bool)((byte)(uVar38 >> 5) & 1);
        uStack_266c = (uint)bVar41 * auVar46._20_4_ | (uint)!bVar41 * 0x50;
        bVar41 = (bool)((byte)(uVar38 >> 6) & 1);
        uStack_2668 = (uint)bVar41 * auVar46._24_4_ | (uint)!bVar41 * 0x50;
        bVar41 = SUB81(uVar38 >> 7,0);
        uStack_2664 = (uint)bVar41 * auVar46._28_4_ | (uint)!bVar41 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar113 = ZEXT3264(local_1e80);
        auVar46 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar48);
        local_2660 = (uint)(local_2b8c & 1) * auVar46._0_4_ |
                     (uint)!(bool)(local_2b8c & 1) * local_1e80._0_4_;
        bVar41 = (bool)((byte)(uVar42 >> 1) & 1);
        uStack_265c = (uint)bVar41 * auVar46._4_4_ | (uint)!bVar41 * local_1e80._4_4_;
        bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
        uStack_2658 = (uint)bVar41 * auVar46._8_4_ | (uint)!bVar41 * local_1e80._8_4_;
        bVar41 = (bool)((byte)(uVar42 >> 3) & 1);
        uStack_2654 = (uint)bVar41 * auVar46._12_4_ | (uint)!bVar41 * local_1e80._12_4_;
        bVar41 = (bool)((byte)(uVar42 >> 4) & 1);
        uStack_2650 = (uint)bVar41 * auVar46._16_4_ | (uint)!bVar41 * local_1e80._16_4_;
        bVar41 = (bool)((byte)(uVar42 >> 5) & 1);
        uStack_264c = (uint)bVar41 * auVar46._20_4_ | (uint)!bVar41 * local_1e80._20_4_;
        bVar41 = (bool)((byte)(uVar42 >> 6) & 1);
        uStack_2648 = (uint)bVar41 * auVar46._24_4_ | (uint)!bVar41 * local_1e80._24_4_;
        bVar41 = SUB81(uVar42 >> 7,0);
        uStack_2644 = (uint)bVar41 * auVar46._28_4_ | (uint)!bVar41 * local_1e80._28_4_;
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar112 = ZEXT3264(auVar46);
        auVar48 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar48);
        local_2640._0_4_ =
             (uint)(local_2b8c & 1) * auVar48._0_4_ | (uint)!(bool)(local_2b8c & 1) * auVar46._0_4_;
        bVar41 = (bool)((byte)(uVar42 >> 1) & 1);
        local_2640._4_4_ = (uint)bVar41 * auVar48._4_4_ | (uint)!bVar41 * auVar46._4_4_;
        bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
        local_2640._8_4_ = (uint)bVar41 * auVar48._8_4_ | (uint)!bVar41 * auVar46._8_4_;
        bVar41 = (bool)((byte)(uVar42 >> 3) & 1);
        local_2640._12_4_ = (uint)bVar41 * auVar48._12_4_ | (uint)!bVar41 * auVar46._12_4_;
        bVar41 = (bool)((byte)(uVar42 >> 4) & 1);
        local_2640._16_4_ = (uint)bVar41 * auVar48._16_4_ | (uint)!bVar41 * auVar46._16_4_;
        bVar41 = (bool)((byte)(uVar42 >> 5) & 1);
        local_2640._20_4_ = (uint)bVar41 * auVar48._20_4_ | (uint)!bVar41 * auVar46._20_4_;
        bVar41 = (bool)((byte)(uVar42 >> 6) & 1);
        local_2640._24_4_ = (uint)bVar41 * auVar48._24_4_ | (uint)!bVar41 * auVar46._24_4_;
        bVar41 = SUB81(uVar42 >> 7,0);
        local_2640._28_4_ = (uint)bVar41 * auVar48._28_4_ | (uint)!bVar41 * auVar46._28_4_;
        local_2b8c = ~local_2b8c;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar38 = 5;
        }
        else {
          uVar38 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2b48 = ray + 0x100;
        puVar33 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar40 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_2660;
        uStack_1e5c = uStack_265c;
        uStack_1e58 = uStack_2658;
        uStack_1e54 = uStack_2654;
        uStack_1e50 = uStack_2650;
        uStack_1e4c = uStack_264c;
        uStack_1e48 = uStack_2648;
        uStack_1e44 = uStack_2644;
        local_2b38 = (undefined1 (*) [32])&local_2880;
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar114 = ZEXT3264(auVar46);
        auVar43 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        auVar115 = ZEXT1664(auVar43);
        local_2b40 = uVar38;
        uStack_2704 = local_2840._28_4_;
        uStack_26e4 = local_2840._60_4_;
LAB_0070330b:
        do {
          bVar32 = (byte)uVar42;
          auVar46 = auVar112._0_32_;
          do {
            root.ptr = puVar33[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_007040ef;
            puVar33 = puVar33 + -1;
            auVar48 = pauVar40[-1];
            auVar68 = ZEXT3264(auVar48);
            pauVar40 = pauVar40 + -1;
            uVar37 = vcmpps_avx512vl(auVar48,local_2640,1);
          } while ((char)uVar37 == '\0');
          uVar36 = (undefined4)uVar37;
          bVar41 = uVar38 < (uint)POPCOUNT(uVar36);
          uVar38 = local_2b40;
          if (bVar41) {
LAB_0070335f:
            do {
              bVar32 = (byte)uVar42;
              uVar37 = 8;
              auVar46 = auVar112._0_32_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007040ef;
                uVar13 = vcmpps_avx512vl(auVar68._0_32_,local_2640,9);
                if ((char)uVar13 == '\0') goto LAB_0070330b;
                uVar37 = (ulong)((uint)root.ptr & 0xf);
                bVar34 = local_2b8c;
                if (uVar37 == 8) goto LAB_00703f96;
                bVar34 = ~local_2b8c;
                lVar35 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar38 = 0;
                goto LAB_0070351a;
              }
              lVar35 = 0;
              auVar46 = auVar113._0_32_;
              do {
                uVar39 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar35 * 8);
                if (uVar39 == 8) {
                  auVar68 = ZEXT3264(auVar46);
                  break;
                }
                auVar26._4_4_ = fStack_271c;
                auVar26._0_4_ = local_2720;
                auVar26._8_4_ = fStack_2718;
                auVar26._12_4_ = fStack_2714;
                auVar26._16_4_ = fStack_2710;
                auVar26._20_4_ = fStack_270c;
                auVar26._24_4_ = fStack_2708;
                auVar26._28_4_ = uStack_2704;
                uVar36 = *(undefined4 *)(root.ptr + 0x20 + lVar35 * 4);
                auVar85._4_4_ = uVar36;
                auVar85._0_4_ = uVar36;
                auVar85._8_4_ = uVar36;
                auVar85._12_4_ = uVar36;
                auVar85._16_4_ = uVar36;
                auVar85._20_4_ = uVar36;
                auVar85._24_4_ = uVar36;
                auVar85._28_4_ = uVar36;
                auVar43 = vfmsub132ps_fma(auVar85,auVar26,local_2780);
                auVar27._4_4_ = fStack_26fc;
                auVar27._0_4_ = local_2700;
                auVar27._8_4_ = fStack_26f8;
                auVar27._12_4_ = fStack_26f4;
                auVar27._16_4_ = fStack_26f0;
                auVar27._20_4_ = fStack_26ec;
                auVar27._24_4_ = fStack_26e8;
                auVar27._28_4_ = uStack_26e4;
                uVar36 = *(undefined4 *)(root.ptr + 0x40 + lVar35 * 4);
                auVar93._4_4_ = uVar36;
                auVar93._0_4_ = uVar36;
                auVar93._8_4_ = uVar36;
                auVar93._12_4_ = uVar36;
                auVar93._16_4_ = uVar36;
                auVar93._20_4_ = uVar36;
                auVar93._24_4_ = uVar36;
                auVar93._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(root.ptr + 0x60 + lVar35 * 4);
                auVar101._4_4_ = uVar36;
                auVar101._0_4_ = uVar36;
                auVar101._8_4_ = uVar36;
                auVar101._12_4_ = uVar36;
                auVar101._16_4_ = uVar36;
                auVar101._20_4_ = uVar36;
                auVar101._24_4_ = uVar36;
                auVar101._28_4_ = uVar36;
                auVar44 = vfmsub132ps_fma(auVar93,auVar27,local_2760);
                auVar45 = vfmsub132ps_fma(auVar101,local_26e0,local_2740);
                uVar36 = *(undefined4 *)(root.ptr + 0x30 + lVar35 * 4);
                auVar53._4_4_ = uVar36;
                auVar53._0_4_ = uVar36;
                auVar53._8_4_ = uVar36;
                auVar53._12_4_ = uVar36;
                auVar53._16_4_ = uVar36;
                auVar53._20_4_ = uVar36;
                auVar53._24_4_ = uVar36;
                auVar53._28_4_ = uVar36;
                auVar47 = vfmsub132ps_avx512vl(local_2780,auVar26,auVar53);
                uVar36 = *(undefined4 *)(root.ptr + 0x50 + lVar35 * 4);
                auVar18._4_4_ = uVar36;
                auVar18._0_4_ = uVar36;
                auVar18._8_4_ = uVar36;
                auVar18._12_4_ = uVar36;
                auVar18._16_4_ = uVar36;
                auVar18._20_4_ = uVar36;
                auVar18._24_4_ = uVar36;
                auVar18._28_4_ = uVar36;
                auVar49 = vfmsub132ps_avx512vl(local_2760,auVar27,auVar18);
                uVar36 = *(undefined4 *)(root.ptr + 0x70 + lVar35 * 4);
                auVar19._4_4_ = uVar36;
                auVar19._0_4_ = uVar36;
                auVar19._8_4_ = uVar36;
                auVar19._12_4_ = uVar36;
                auVar19._16_4_ = uVar36;
                auVar19._20_4_ = uVar36;
                auVar19._24_4_ = uVar36;
                auVar19._28_4_ = uVar36;
                auVar50 = vfmsub132ps_avx512vl(local_2740,local_26e0,auVar19);
                auVar48 = vpminsd_avx2(ZEXT1632(auVar43),auVar47);
                auVar51 = vpminsd_avx2(ZEXT1632(auVar44),auVar49);
                auVar48 = vpmaxsd_avx2(auVar48,auVar51);
                auVar51 = vpminsd_avx2(ZEXT1632(auVar45),auVar50);
                auVar48 = vpmaxsd_avx2(auVar48,auVar51);
                auVar51 = vpmaxsd_avx2(ZEXT1632(auVar43),auVar47);
                auVar47 = vpmaxsd_avx2(ZEXT1632(auVar44),auVar49);
                auVar47 = vpminsd_avx2(auVar51,auVar47);
                auVar51 = vpmaxsd_avx2(ZEXT1632(auVar45),auVar50);
                auVar47 = vpminsd_avx2(auVar47,auVar51);
                auVar28._4_4_ = uStack_265c;
                auVar28._0_4_ = local_2660;
                auVar28._8_4_ = uStack_2658;
                auVar28._12_4_ = uStack_2654;
                auVar28._16_4_ = uStack_2650;
                auVar28._20_4_ = uStack_264c;
                auVar28._24_4_ = uStack_2648;
                auVar28._28_4_ = uStack_2644;
                auVar51 = vpmaxsd_avx2(auVar48,auVar28);
                auVar47 = vpminsd_avx2(auVar47,local_2640);
                uVar15 = vpcmpd_avx512vl(auVar51,auVar47,2);
                if ((byte)uVar15 == 0) {
                  auVar68 = ZEXT3264(auVar46);
                  uVar39 = uVar37;
                }
                else {
                  auVar51 = vblendmps_avx512vl(auVar113._0_32_,auVar48);
                  bVar41 = (bool)((byte)uVar15 & 1);
                  bVar6 = (bool)((byte)(uVar15 >> 1) & 1);
                  bVar7 = (bool)((byte)(uVar15 >> 2) & 1);
                  bVar8 = (bool)((byte)(uVar15 >> 3) & 1);
                  bVar9 = (bool)((byte)(uVar15 >> 4) & 1);
                  bVar10 = (bool)((byte)(uVar15 >> 5) & 1);
                  bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
                  bVar12 = SUB81(uVar15 >> 7,0);
                  auVar68 = ZEXT3264(CONCAT428((uint)bVar12 * auVar51._28_4_ |
                                               (uint)!bVar12 * auVar48._28_4_,
                                               CONCAT424((uint)bVar11 * auVar51._24_4_ |
                                                         (uint)!bVar11 * auVar48._24_4_,
                                                         CONCAT420((uint)bVar10 * auVar51._20_4_ |
                                                                   (uint)!bVar10 * auVar48._20_4_,
                                                                   CONCAT416((uint)bVar9 *
                                                                             auVar51._16_4_ |
                                                                             (uint)!bVar9 *
                                                                             auVar48._16_4_,
                                                                             CONCAT412((uint)bVar8 *
                                                                                       auVar51.
                                                  _12_4_ | (uint)!bVar8 * auVar48._12_4_,
                                                  CONCAT48((uint)bVar7 * auVar51._8_4_ |
                                                           (uint)!bVar7 * auVar48._8_4_,
                                                           CONCAT44((uint)bVar6 * auVar51._4_4_ |
                                                                    (uint)!bVar6 * auVar48._4_4_,
                                                                    (uint)bVar41 * auVar51._0_4_ |
                                                                    (uint)!bVar41 * auVar48._0_4_)))
                                                  )))));
                  if (uVar37 != 8) {
                    *puVar33 = uVar37;
                    puVar33 = puVar33 + 1;
                    *pauVar40 = auVar46;
                    pauVar40 = pauVar40 + 1;
                  }
                }
                uVar37 = uVar39;
                lVar35 = lVar35 + 1;
                auVar46 = auVar68._0_32_;
              } while (lVar35 != 4);
              if (uVar37 == 8) goto LAB_007034c3;
              uVar13 = vcmpps_avx512vl(auVar68._0_32_,local_2640,9);
              root.ptr = uVar37;
            } while ((byte)uVar38 < (byte)POPCOUNT((int)uVar13));
            *puVar33 = uVar37;
            puVar33 = puVar33 + 1;
            *pauVar40 = auVar68._0_32_;
            pauVar40 = pauVar40 + 1;
LAB_007034c3:
            iVar30 = 4;
          }
          else {
            do {
              local_29a0 = auVar48;
              k = 0;
              for (uVar38 = uVar37; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              bVar41 = occluded1(This,bvh,root,k,&local_2b51,ray,
                                 (TravRayK<8,_false> *)&local_2840.field_0,context);
              bVar32 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar41) {
                bVar32 = 0;
              }
              local_2b8c = local_2b8c | bVar32;
              uVar37 = uVar37 - 1 & uVar37;
              auVar48 = local_29a0;
            } while (uVar37 != 0);
            iVar30 = 3;
            if (local_2b8c != 0xff) {
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_2640._0_4_ =
                   (uint)(local_2b8c & 1) * auVar46._0_4_ |
                   (uint)!(bool)(local_2b8c & 1) * local_2640._0_4_;
              bVar41 = (bool)(local_2b8c >> 1 & 1);
              local_2640._4_4_ = (uint)bVar41 * auVar46._4_4_ | (uint)!bVar41 * local_2640._4_4_;
              bVar41 = (bool)(local_2b8c >> 2 & 1);
              local_2640._8_4_ = (uint)bVar41 * auVar46._8_4_ | (uint)!bVar41 * local_2640._8_4_;
              bVar41 = (bool)(local_2b8c >> 3 & 1);
              local_2640._12_4_ = (uint)bVar41 * auVar46._12_4_ | (uint)!bVar41 * local_2640._12_4_;
              bVar41 = (bool)(local_2b8c >> 4 & 1);
              local_2640._16_4_ = (uint)bVar41 * auVar46._16_4_ | (uint)!bVar41 * local_2640._16_4_;
              bVar41 = (bool)(local_2b8c >> 5 & 1);
              local_2640._20_4_ = (uint)bVar41 * auVar46._20_4_ | (uint)!bVar41 * local_2640._20_4_;
              bVar41 = (bool)(local_2b8c >> 6 & 1);
              local_2640._24_4_ = (uint)bVar41 * auVar46._24_4_ | (uint)!bVar41 * local_2640._24_4_;
              local_2640._28_4_ =
                   (uint)(local_2b8c >> 7) * auVar46._28_4_ |
                   (uint)!(bool)(local_2b8c >> 7) * local_2640._28_4_;
              iVar30 = 2;
            }
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar111 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar112 = ZEXT3264(auVar46);
            uVar42 = uVar42 & 0xffffffff;
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar113 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar114 = ZEXT3264(auVar46);
            auVar43 = vxorps_avx512vl(auVar115._0_16_,auVar115._0_16_);
            auVar115 = ZEXT1664(auVar43);
            auVar68 = ZEXT3264(local_29a0);
            uVar38 = local_2b40;
            if ((uint)local_2b40 < (uint)POPCOUNT(uVar36)) goto LAB_0070335f;
          }
          bVar32 = (byte)uVar42;
          auVar46 = auVar112._0_32_;
        } while (iVar30 != 3);
LAB_007040ef:
        local_2b8c = local_2b8c & bVar32;
        bVar41 = (bool)(local_2b8c >> 1 & 1);
        bVar6 = (bool)(local_2b8c >> 2 & 1);
        bVar7 = (bool)(local_2b8c >> 3 & 1);
        bVar8 = (bool)(local_2b8c >> 4 & 1);
        bVar9 = (bool)(local_2b8c >> 5 & 1);
        bVar10 = (bool)(local_2b8c >> 6 & 1);
        *(uint *)local_2b48 =
             (uint)(local_2b8c & 1) * auVar46._0_4_ |
             (uint)!(bool)(local_2b8c & 1) * *(int *)local_2b48;
        *(uint *)(local_2b48 + 4) =
             (uint)bVar41 * auVar46._4_4_ | (uint)!bVar41 * *(int *)(local_2b48 + 4);
        *(uint *)(local_2b48 + 8) =
             (uint)bVar6 * auVar46._8_4_ | (uint)!bVar6 * *(int *)(local_2b48 + 8);
        *(uint *)(local_2b48 + 0xc) =
             (uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * *(int *)(local_2b48 + 0xc);
        *(uint *)(local_2b48 + 0x10) =
             (uint)bVar8 * auVar46._16_4_ | (uint)!bVar8 * *(int *)(local_2b48 + 0x10);
        *(uint *)(local_2b48 + 0x14) =
             (uint)bVar9 * auVar46._20_4_ | (uint)!bVar9 * *(int *)(local_2b48 + 0x14);
        *(uint *)(local_2b48 + 0x18) =
             (uint)bVar10 * auVar46._24_4_ | (uint)!bVar10 * *(int *)(local_2b48 + 0x18);
        *(uint *)(local_2b48 + 0x1c) =
             (uint)(local_2b8c >> 7) * auVar46._28_4_ |
             (uint)!(bool)(local_2b8c >> 7) * *(int *)(local_2b48 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar38 = local_2a98 + 1;
    lVar35 = lVar35 + 0xe0;
    if (uVar37 - 8 <= uVar38) break;
LAB_0070351a:
    local_29a0._0_8_ = uVar38 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    uVar39 = 0;
    local_2a98 = uVar38;
    bVar32 = bVar34;
    while( true ) {
      auVar43 = auVar115._0_16_;
      uVar38 = (ulong)*(uint *)(lVar35 + uVar39 * 4);
      if (uVar38 == 0xffffffff) break;
      uVar36 = *(undefined4 *)(lVar35 + -0xc0 + uVar39 * 4);
      auVar45._4_4_ = uVar36;
      auVar45._0_4_ = uVar36;
      auVar45._8_4_ = uVar36;
      auVar45._12_4_ = uVar36;
      auVar84._16_4_ = uVar36;
      auVar84._0_16_ = auVar45;
      auVar84._20_4_ = uVar36;
      auVar84._24_4_ = uVar36;
      auVar84._28_4_ = uVar36;
      uVar36 = *(undefined4 *)(lVar35 + -0xb0 + uVar39 * 4);
      auVar92._4_4_ = uVar36;
      auVar92._0_4_ = uVar36;
      auVar92._8_4_ = uVar36;
      auVar92._12_4_ = uVar36;
      auVar94._16_4_ = uVar36;
      auVar94._0_16_ = auVar92;
      auVar94._20_4_ = uVar36;
      auVar94._24_4_ = uVar36;
      auVar94._28_4_ = uVar36;
      uVar36 = *(undefined4 *)(lVar35 + -0xa0 + uVar39 * 4);
      auVar98._4_4_ = uVar36;
      auVar98._0_4_ = uVar36;
      auVar98._8_4_ = uVar36;
      auVar98._12_4_ = uVar36;
      auVar99._16_4_ = uVar36;
      auVar99._0_16_ = auVar98;
      auVar99._20_4_ = uVar36;
      auVar99._24_4_ = uVar36;
      auVar99._28_4_ = uVar36;
      auVar52 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar35 + -0x90 + uVar39 * 4)));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar35 + -0x80 + uVar39 * 4)));
      auVar54 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar35 + -0x70 + uVar39 * 4)));
      auVar55 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar35 + -0x60 + uVar39 * 4)));
      auVar56 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar35 + -0x50 + uVar39 * 4)));
      auVar57 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar35 + -0x40 + uVar39 * 4)));
      auVar58 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar35 + -0x30 + uVar39 * 4)));
      auVar59 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar35 + -0x20 + uVar39 * 4)));
      auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar35 + -0x10 + uVar39 * 4)));
      local_2a90 = *(undefined8 *)(local_29a0._0_8_ + 0xd0);
      uStack_2a88 = *(undefined8 *)(local_29a0._0_8_ + 0xd8);
      auVar44 = vsubss_avx512f(auVar45,auVar52._0_16_);
      fVar72 = auVar44._0_4_;
      auVar77._4_4_ = fVar72;
      auVar77._0_4_ = fVar72;
      auVar77._8_4_ = fVar72;
      auVar77._12_4_ = fVar72;
      auVar77._16_4_ = fVar72;
      auVar77._20_4_ = fVar72;
      auVar77._24_4_ = fVar72;
      auVar77._28_4_ = fVar72;
      auVar44 = vsubss_avx512f(auVar92,auVar53._0_16_);
      fVar66 = auVar44._0_4_;
      auVar86._4_4_ = fVar66;
      auVar86._0_4_ = fVar66;
      auVar86._8_4_ = fVar66;
      auVar86._12_4_ = fVar66;
      auVar86._16_4_ = fVar66;
      auVar86._20_4_ = fVar66;
      auVar86._24_4_ = fVar66;
      auVar86._28_4_ = fVar66;
      auVar44 = vsubss_avx512f(auVar98,auVar54._0_16_);
      fVar67 = auVar44._0_4_;
      auVar63._4_4_ = fVar67;
      auVar63._0_4_ = fVar67;
      auVar63._8_4_ = fVar67;
      auVar63._12_4_ = fVar67;
      auVar63._16_4_ = fVar67;
      auVar63._20_4_ = fVar67;
      auVar63._24_4_ = fVar67;
      auVar63._28_4_ = fVar67;
      auVar44 = vsubss_avx512f(auVar58._0_16_,auVar45);
      fVar89 = auVar44._0_4_;
      auVar110._4_4_ = fVar89;
      auVar110._0_4_ = fVar89;
      auVar110._8_4_ = fVar89;
      auVar110._12_4_ = fVar89;
      auVar110._16_4_ = fVar89;
      auVar110._20_4_ = fVar89;
      auVar110._24_4_ = fVar89;
      auVar110._28_4_ = fVar89;
      auVar44 = vsubss_avx512f(auVar59._0_16_,auVar92);
      auVar61 = vbroadcastss_avx512vl(auVar44);
      auVar45 = vsubss_avx512f(auVar60._0_16_,auVar98);
      auVar62 = vbroadcastss_avx512vl(auVar45);
      fVar66 = auVar45._0_4_ * fVar66;
      auVar50._4_4_ = fVar66;
      auVar50._0_4_ = fVar66;
      auVar50._8_4_ = fVar66;
      auVar50._12_4_ = fVar66;
      auVar50._16_4_ = fVar66;
      auVar50._20_4_ = fVar66;
      auVar50._24_4_ = fVar66;
      auVar50._28_4_ = fVar66;
      auVar63 = vfmsub231ps_avx512vl(auVar50,auVar61,auVar63);
      fVar89 = fVar67 * fVar89;
      auVar64._4_4_ = fVar89;
      auVar64._0_4_ = fVar89;
      auVar64._8_4_ = fVar89;
      auVar64._12_4_ = fVar89;
      auVar64._16_4_ = fVar89;
      auVar64._20_4_ = fVar89;
      auVar64._24_4_ = fVar89;
      auVar64._28_4_ = fVar89;
      auVar64 = vfmsub231ps_avx512vl(auVar64,auVar62,auVar77);
      uVar2 = auVar64._28_4_;
      auVar71 = ZEXT436(uVar2);
      auVar70 = ZEXT436(uVar2);
      fVar72 = auVar44._0_4_ * fVar72;
      auVar73._4_4_ = fVar72;
      auVar73._0_4_ = fVar72;
      auVar73._8_4_ = fVar72;
      auVar73._12_4_ = fVar72;
      auVar73._16_4_ = fVar72;
      auVar73._20_4_ = fVar72;
      auVar73._24_4_ = fVar72;
      auVar73._28_4_ = fVar72;
      auVar92 = vfmsub231ps_fma(auVar73,auVar110,auVar86);
      auVar76 = (undefined1  [36])0x0;
      auVar75 = (undefined1  [36])0x0;
      auVar47 = vsubps_avx(auVar84,*(undefined1 (*) [32])ray);
      auVar49 = vsubps_avx(auVar94,*(undefined1 (*) [32])(ray + 0x20));
      auVar50 = vsubps_avx(auVar99,*(undefined1 (*) [32])(ray + 0x40));
      auVar46 = *(undefined1 (*) [32])(ray + 0x80);
      auVar48 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar51 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar68._0_4_ = auVar48._0_4_ * auVar50._0_4_;
      auVar68._4_4_ = auVar48._4_4_ * auVar50._4_4_;
      auVar68._8_4_ = auVar48._8_4_ * auVar50._8_4_;
      auVar68._12_4_ = auVar48._12_4_ * auVar50._12_4_;
      auVar68._16_4_ = auVar48._16_4_ * auVar50._16_4_;
      auVar68._20_4_ = auVar48._20_4_ * auVar50._20_4_;
      auVar68._28_36_ = in_ZMM12._28_36_;
      auVar68._24_4_ = auVar48._24_4_ * auVar50._24_4_;
      auVar98 = vfmsub231ps_fma(auVar68._0_32_,auVar49,auVar51);
      in_ZMM12 = ZEXT1664(auVar98);
      auVar106._0_4_ = auVar51._0_4_ * auVar47._0_4_;
      auVar106._4_4_ = auVar51._4_4_ * auVar47._4_4_;
      auVar106._8_4_ = auVar51._8_4_ * auVar47._8_4_;
      auVar106._12_4_ = auVar51._12_4_ * auVar47._12_4_;
      auVar106._16_4_ = auVar51._16_4_ * auVar47._16_4_;
      auVar106._20_4_ = auVar51._20_4_ * auVar47._20_4_;
      auVar106._28_36_ = in_ZMM13._28_36_;
      auVar106._24_4_ = auVar51._24_4_ * auVar47._24_4_;
      auVar16 = vfmsub231ps_fma(auVar106._0_32_,auVar50,auVar46);
      in_ZMM13 = ZEXT1664(auVar16);
      auVar108._0_4_ = auVar46._0_4_ * auVar49._0_4_;
      auVar108._4_4_ = auVar46._4_4_ * auVar49._4_4_;
      auVar108._8_4_ = auVar46._8_4_ * auVar49._8_4_;
      auVar108._12_4_ = auVar46._12_4_ * auVar49._12_4_;
      auVar108._16_4_ = auVar46._16_4_ * auVar49._16_4_;
      auVar108._20_4_ = auVar46._20_4_ * auVar49._20_4_;
      auVar108._28_36_ = in_ZMM14._28_36_;
      auVar108._24_4_ = auVar46._24_4_ * auVar49._24_4_;
      auVar17 = vfmsub231ps_fma(auVar108._0_32_,auVar47,auVar48);
      in_ZMM14 = ZEXT1664(auVar17);
      auVar65._4_4_ = auVar51._4_4_ * auVar92._4_4_;
      auVar65._0_4_ = auVar51._0_4_ * auVar92._0_4_;
      auVar65._8_4_ = auVar51._8_4_ * auVar92._8_4_;
      auVar65._12_4_ = auVar51._12_4_ * auVar92._12_4_;
      auVar65._16_4_ = auVar51._16_4_ * 0.0;
      auVar65._20_4_ = auVar51._20_4_ * 0.0;
      auVar65._24_4_ = auVar51._24_4_ * 0.0;
      auVar65._28_4_ = auVar51._28_4_;
      auVar44 = vfmadd231ps_fma(auVar65,auVar64,auVar48);
      auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar63,auVar46);
      vandps_avx512vl(ZEXT1632(auVar44),auVar114._0_32_);
      auVar46 = vmulps_avx512vl(auVar62,ZEXT1632(auVar17));
      auVar46 = vfmadd231ps_avx512vl(auVar46,ZEXT1632(auVar16),auVar61);
      auVar45 = vfmadd231ps_fma(auVar46,ZEXT1632(auVar98),auVar110);
      uVar102 = auVar64._0_4_;
      auVar61._0_4_ = (float)(uVar102 ^ auVar45._0_4_);
      uVar103 = auVar64._4_4_;
      auVar61._4_4_ = (float)(uVar103 ^ auVar45._4_4_);
      uVar104 = auVar64._8_4_;
      auVar61._8_4_ = (float)(uVar104 ^ auVar45._8_4_);
      uVar105 = auVar64._12_4_;
      auVar61._12_4_ = (float)(uVar105 ^ auVar45._12_4_);
      fVar66 = auVar64._16_4_;
      auVar61._16_4_ = fVar66;
      fVar89 = auVar64._20_4_;
      auVar61._20_4_ = fVar89;
      fVar72 = auVar64._24_4_;
      auVar61._24_4_ = fVar72;
      auVar61._28_4_ = uVar2;
      uVar13 = vcmpps_avx512vl(auVar61,auVar115._0_32_,5);
      bVar31 = (byte)uVar13 & bVar32;
      if (bVar31 != 0) {
        auVar62._4_4_ = fVar67 * auVar17._4_4_;
        auVar62._0_4_ = fVar67 * auVar17._0_4_;
        auVar62._8_4_ = fVar67 * auVar17._8_4_;
        auVar62._12_4_ = fVar67 * auVar17._12_4_;
        auVar62._16_4_ = fVar67 * 0.0;
        auVar62._20_4_ = fVar67 * 0.0;
        auVar62._24_4_ = fVar67 * 0.0;
        auVar62._28_4_ = fVar67;
        auVar45 = vfmadd213ps_fma(auVar86,ZEXT1632(auVar16),auVar62);
        auVar45 = vfmadd213ps_fma(auVar77,ZEXT1632(auVar98),ZEXT1632(auVar45));
        auVar87._0_4_ = (float)(uVar102 ^ auVar45._0_4_);
        auVar87._4_4_ = (float)(uVar103 ^ auVar45._4_4_);
        auVar87._8_4_ = (float)(uVar104 ^ auVar45._8_4_);
        auVar87._12_4_ = (float)(uVar105 ^ auVar45._12_4_);
        auVar87._16_4_ = fVar66;
        auVar87._20_4_ = fVar89;
        auVar87._24_4_ = fVar72;
        auVar87._28_4_ = uVar2;
        uVar13 = vcmpps_avx512vl(auVar87,auVar115._0_32_,5);
        bVar31 = bVar31 & (byte)uVar13;
        if (bVar31 != 0) {
          vandps_avx512vl(ZEXT1632(auVar44),auVar111._0_32_);
          auVar48 = vsubps_avx(auVar46,auVar61);
          uVar13 = vcmpps_avx512vl(auVar48,auVar87,5);
          bVar31 = bVar31 & (byte)uVar13;
          if (bVar31 != 0) {
            auVar20._4_4_ = auVar50._4_4_ * auVar92._4_4_;
            auVar20._0_4_ = auVar50._0_4_ * auVar92._0_4_;
            auVar20._8_4_ = auVar50._8_4_ * auVar92._8_4_;
            auVar20._12_4_ = auVar50._12_4_ * auVar92._12_4_;
            auVar20._16_4_ = auVar50._16_4_ * 0.0;
            auVar20._20_4_ = auVar50._20_4_ * 0.0;
            auVar20._24_4_ = auVar50._24_4_ * 0.0;
            auVar20._28_4_ = auVar50._28_4_;
            auVar45 = vfmadd213ps_fma(auVar49,auVar64,auVar20);
            auVar45 = vfmadd213ps_fma(auVar47,auVar63,ZEXT1632(auVar45));
            auVar91._0_4_ = uVar102 ^ auVar45._0_4_;
            auVar91._4_4_ = uVar103 ^ auVar45._4_4_;
            auVar91._8_4_ = uVar104 ^ auVar45._8_4_;
            auVar91._12_4_ = uVar105 ^ auVar45._12_4_;
            auVar91._16_4_ = fVar66;
            auVar91._20_4_ = fVar89;
            auVar91._24_4_ = fVar72;
            auVar91._28_4_ = uVar2;
            auVar95._0_4_ = auVar46._0_4_ * *(float *)(ray + 0x60);
            auVar95._4_4_ = auVar46._4_4_ * *(float *)(ray + 100);
            auVar95._8_4_ = auVar46._8_4_ * *(float *)(ray + 0x68);
            auVar95._12_4_ = auVar46._12_4_ * *(float *)(ray + 0x6c);
            auVar95._16_4_ = auVar46._16_4_ * *(float *)(ray + 0x70);
            auVar95._20_4_ = auVar46._20_4_ * *(float *)(ray + 0x74);
            auVar95._24_4_ = auVar46._24_4_ * *(float *)(ray + 0x78);
            auVar95._28_4_ = 0;
            local_2980 = *(float *)(ray + 0x100);
            fStack_297c = *(float *)(ray + 0x104);
            fStack_2978 = *(float *)(ray + 0x108);
            fStack_2974 = *(float *)(ray + 0x10c);
            fStack_2970 = *(float *)(ray + 0x110);
            fStack_296c = *(float *)(ray + 0x114);
            fStack_2968 = *(float *)(ray + 0x118);
            iStack_2964 = *(int *)(ray + 0x11c);
            auVar21._4_4_ = fStack_297c * auVar46._4_4_;
            auVar21._0_4_ = local_2980 * auVar46._0_4_;
            auVar21._8_4_ = fStack_2978 * auVar46._8_4_;
            auVar21._12_4_ = fStack_2974 * auVar46._12_4_;
            auVar21._16_4_ = fStack_2970 * auVar46._16_4_;
            auVar21._20_4_ = fStack_296c * auVar46._20_4_;
            auVar21._24_4_ = fStack_2968 * auVar46._24_4_;
            auVar21._28_4_ = iStack_2964;
            uVar13 = vcmpps_avx512vl(auVar91,auVar21,2);
            uVar14 = vcmpps_avx512vl(auVar95,auVar91,1);
            bVar31 = bVar31 & (byte)uVar13 & (byte)uVar14;
            local_2b00 = auVar55;
            local_2ae0 = auVar56;
            local_2a80 = auVar60;
            local_2a60 = auVar59;
            local_2a40 = auVar58;
            local_2a20 = auVar54;
            local_2a00 = auVar53;
            local_29e0 = auVar52;
            local_29c0 = auVar57;
            auVar70 = auVar71;
            auVar75 = auVar76;
            if (bVar31 != 0) {
              uVar13 = vcmpps_avx512vl(ZEXT1632(auVar44),ZEXT832(0) << 0x20,4);
              bVar31 = bVar31 & (byte)uVar13;
              if (bVar31 != 0) {
                local_2b50 = (context->scene->geometries).items[uVar38].ptr;
                uVar102 = local_2b50->mask;
                auVar55._4_4_ = uVar102;
                auVar55._0_4_ = uVar102;
                auVar55._8_4_ = uVar102;
                auVar55._12_4_ = uVar102;
                auVar55._16_4_ = uVar102;
                auVar55._20_4_ = uVar102;
                auVar55._24_4_ = uVar102;
                auVar55._28_4_ = uVar102;
                uVar13 = vptestmd_avx512vl(auVar55,*(undefined1 (*) [32])(ray + 0x120));
                bVar31 = bVar31 & (byte)uVar13;
                if (bVar31 != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (auVar70 = ZEXT436(uVar2), auVar75 = (undefined1  [36])0x0,
                     local_2b50->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar48 = vrcp14ps_avx512vl(auVar46);
                    auVar59._8_4_ = 0x3f800000;
                    auVar59._0_8_ = 0x3f8000003f800000;
                    auVar59._12_4_ = 0x3f800000;
                    auVar59._16_4_ = 0x3f800000;
                    auVar59._20_4_ = 0x3f800000;
                    auVar59._24_4_ = 0x3f800000;
                    auVar59._28_4_ = 0x3f800000;
                    auVar44 = vfnmadd213ps_fma(auVar46,auVar48,auVar59);
                    auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar48,auVar48);
                    auVar58._4_4_ = auVar44._4_4_ * auVar61._4_4_;
                    auVar58._0_4_ = auVar44._0_4_ * auVar61._0_4_;
                    auVar58._8_4_ = auVar44._8_4_ * auVar61._8_4_;
                    auVar58._12_4_ = auVar44._12_4_ * auVar61._12_4_;
                    auVar58._16_4_ = fVar66 * 0.0;
                    auVar58._20_4_ = fVar89 * 0.0;
                    auVar58._24_4_ = fVar72 * 0.0;
                    auVar58._28_4_ = uVar2;
                    local_2900 = vminps_avx(auVar58,auVar59);
                    auVar56._4_4_ = auVar44._4_4_ * auVar87._4_4_;
                    auVar56._0_4_ = auVar44._0_4_ * auVar87._0_4_;
                    auVar56._8_4_ = auVar44._8_4_ * auVar87._8_4_;
                    auVar56._12_4_ = auVar44._12_4_ * auVar87._12_4_;
                    auVar56._16_4_ = fVar66 * 0.0;
                    auVar56._20_4_ = fVar89 * 0.0;
                    auVar56._24_4_ = fVar72 * 0.0;
                    auVar56._28_4_ = uVar2;
                    local_28e0 = vminps_avx(auVar56,auVar59);
                    pRVar4 = context->user;
                    local_28a0 = vpbroadcastd_avx512vl();
                    local_28c0 = vpbroadcastd_avx512vl();
                    local_2920 = ZEXT1632(auVar92);
                    auVar46 = vpcmpeqd_avx2(auVar63,auVar63);
                    local_2b38[1] = auVar46;
                    *local_2b38 = auVar46;
                    local_2880 = pRVar4->instID[0];
                    local_2860 = pRVar4->instPrimID[0];
                    auVar46 = vmulps_avx512vl(ZEXT1632(auVar44),auVar91);
                    bVar41 = (bool)(bVar31 >> 1 & 1);
                    bVar6 = (bool)(bVar31 >> 2 & 1);
                    bVar7 = (bool)(bVar31 >> 3 & 1);
                    bVar8 = (bool)(bVar31 >> 4 & 1);
                    bVar9 = (bool)(bVar31 >> 5 & 1);
                    bVar10 = (bool)(bVar31 >> 6 & 1);
                    *(uint *)(ray + 0x100) =
                         (uint)(bVar31 & 1) * auVar46._0_4_ |
                         (uint)!(bool)(bVar31 & 1) * (int)local_2980;
                    *(uint *)(ray + 0x104) =
                         (uint)bVar41 * auVar46._4_4_ | (uint)!bVar41 * (int)fStack_297c;
                    *(uint *)(ray + 0x108) =
                         (uint)bVar6 * auVar46._8_4_ | (uint)!bVar6 * (int)fStack_2978;
                    *(uint *)(ray + 0x10c) =
                         (uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * (int)fStack_2974;
                    *(uint *)(ray + 0x110) =
                         (uint)bVar8 * auVar46._16_4_ | (uint)!bVar8 * (int)fStack_2970;
                    *(uint *)(ray + 0x114) =
                         (uint)bVar9 * auVar46._20_4_ | (uint)!bVar9 * (int)fStack_296c;
                    *(uint *)(ray + 0x118) =
                         (uint)bVar10 * auVar46._24_4_ | (uint)!bVar10 * (int)fStack_2968;
                    *(uint *)(ray + 0x11c) =
                         (uint)(bVar31 >> 7) * auVar46._28_4_ |
                         (uint)!(bool)(bVar31 >> 7) * iStack_2964;
                    local_2ac0 = vpmovm2d_avx512vl((ulong)bVar31);
                    local_2b30.valid = (int *)local_2ac0;
                    local_2b30.geometryUserPtr = local_2b50->userPtr;
                    local_2b30.context = context->user;
                    local_2b30.hit = local_2960;
                    local_2b30.N = 8;
                    local_2b30.ray = (RTCRayN *)ray;
                    local_2960 = (RTCHitN  [32])auVar63;
                    local_2940 = auVar64;
                    uStack_287c = local_2880;
                    uStack_2878 = local_2880;
                    uStack_2874 = local_2880;
                    uStack_2870 = local_2880;
                    uStack_286c = local_2880;
                    uStack_2868 = local_2880;
                    uStack_2864 = local_2880;
                    uStack_285c = local_2860;
                    uStack_2858 = local_2860;
                    uStack_2854 = local_2860;
                    uStack_2850 = local_2860;
                    uStack_284c = local_2860;
                    uStack_2848 = local_2860;
                    uStack_2844 = local_2860;
                    auVar70 = ZEXT436(uVar2);
                    auVar75 = (undefined1  [36])0x0;
                    if (local_2b50->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar75 = (undefined1  [36])0x0;
                      in_ZMM12 = ZEXT1664(auVar98);
                      in_ZMM13 = ZEXT1664(auVar16);
                      in_ZMM14 = ZEXT1664(auVar17);
                      (*local_2b50->occlusionFilterN)(&local_2b30);
                      auVar70 = extraout_var;
                    }
                    if (local_2ac0 == (undefined1  [32])0x0) {
                      uVar38 = 0;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_2b50->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar75 = (undefined1  [36])0x0;
                        in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                        in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                        (*p_Var5)(&local_2b30);
                        auVar70 = extraout_var_00;
                      }
                      uVar38 = vptestmd_avx512vl(local_2ac0,local_2ac0);
                      auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar41 = (bool)((byte)uVar38 & 1);
                      bVar6 = (bool)((byte)(uVar38 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar38 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar38 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar38 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar38 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar38 >> 6) & 1);
                      bVar12 = SUB81(uVar38 >> 7,0);
                      *(uint *)(local_2b30.ray + 0x100) =
                           (uint)bVar41 * auVar46._0_4_ |
                           (uint)!bVar41 * *(int *)(local_2b30.ray + 0x100);
                      *(uint *)(local_2b30.ray + 0x104) =
                           (uint)bVar6 * auVar46._4_4_ |
                           (uint)!bVar6 * *(int *)(local_2b30.ray + 0x104);
                      *(uint *)(local_2b30.ray + 0x108) =
                           (uint)bVar7 * auVar46._8_4_ |
                           (uint)!bVar7 * *(int *)(local_2b30.ray + 0x108);
                      *(uint *)(local_2b30.ray + 0x10c) =
                           (uint)bVar8 * auVar46._12_4_ |
                           (uint)!bVar8 * *(int *)(local_2b30.ray + 0x10c);
                      *(uint *)(local_2b30.ray + 0x110) =
                           (uint)bVar9 * auVar46._16_4_ |
                           (uint)!bVar9 * *(int *)(local_2b30.ray + 0x110);
                      *(uint *)(local_2b30.ray + 0x114) =
                           (uint)bVar10 * auVar46._20_4_ |
                           (uint)!bVar10 * *(int *)(local_2b30.ray + 0x114);
                      *(uint *)(local_2b30.ray + 0x118) =
                           (uint)bVar11 * auVar46._24_4_ |
                           (uint)!bVar11 * *(int *)(local_2b30.ray + 0x118);
                      *(uint *)(local_2b30.ray + 0x11c) =
                           (uint)bVar12 * auVar46._28_4_ |
                           (uint)!bVar12 * *(int *)(local_2b30.ray + 0x11c);
                    }
                    bVar31 = (byte)uVar38;
                    auVar57._0_4_ =
                         (uint)(bVar31 & 1) * *(int *)local_2b48 |
                         (uint)!(bool)(bVar31 & 1) * (int)local_2980;
                    bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
                    auVar57._4_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 4) | (uint)!bVar41 * (int)fStack_297c;
                    bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
                    auVar57._8_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 8) | (uint)!bVar41 * (int)fStack_2978;
                    bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
                    auVar57._12_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 0xc) |
                         (uint)!bVar41 * (int)fStack_2974;
                    bVar41 = (bool)((byte)(uVar38 >> 4) & 1);
                    auVar57._16_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 0x10) |
                         (uint)!bVar41 * (int)fStack_2970;
                    bVar41 = (bool)((byte)(uVar38 >> 5) & 1);
                    auVar57._20_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 0x14) |
                         (uint)!bVar41 * (int)fStack_296c;
                    bVar41 = (bool)((byte)(uVar38 >> 6) & 1);
                    auVar57._24_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 0x18) |
                         (uint)!bVar41 * (int)fStack_2968;
                    bVar41 = (bool)((byte)(uVar38 >> 7) & 1);
                    auVar57._28_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 0x1c) | (uint)!bVar41 * iStack_2964;
                    *(undefined1 (*) [32])local_2b48 = auVar57;
                  }
                  bVar32 = bVar32 & ~bVar31;
                }
              }
            }
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar111 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar112 = ZEXT3264(auVar46);
            uVar42 = uVar42 & 0xffffffff;
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar113 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar114 = ZEXT3264(auVar46);
            auVar43 = vxorps_avx512vl(auVar43,auVar43);
            auVar115 = ZEXT1664(auVar43);
            auVar55 = local_2b00;
            auVar58 = local_2a40;
            auVar56 = local_2ae0;
            auVar59 = local_2a60;
            auVar57 = local_29c0;
            auVar60 = local_2a80;
            auVar52 = local_29e0;
            auVar53 = local_2a00;
            auVar54 = local_2a20;
          }
        }
      }
      auVar43 = auVar115._0_16_;
      if (bVar32 == 0) {
        bVar32 = 0;
        break;
      }
      auVar47 = vsubps_avx512vl(auVar55,auVar58);
      auVar49 = vsubps_avx512vl(auVar56,auVar59);
      auVar50 = vsubps_avx512vl(auVar57,auVar60);
      auVar65 = vsubps_avx512vl(auVar52,auVar55);
      auVar58 = vsubps_avx512vl(auVar53,auVar56);
      auVar59 = vsubps_avx512vl(auVar54,auVar57);
      auVar46 = vmulps_avx512vl(auVar49,auVar59);
      auVar45 = vfmsub231ps_fma(auVar46,auVar58,auVar50);
      auVar69._0_4_ = auVar50._0_4_ * auVar65._0_4_;
      auVar69._4_4_ = auVar50._4_4_ * auVar65._4_4_;
      auVar69._8_4_ = auVar50._8_4_ * auVar65._8_4_;
      auVar69._12_4_ = auVar50._12_4_ * auVar65._12_4_;
      auVar69._16_4_ = auVar50._16_4_ * auVar65._16_4_;
      auVar69._20_4_ = auVar50._20_4_ * auVar65._20_4_;
      auVar69._24_4_ = auVar50._24_4_ * auVar65._24_4_;
      auVar69._28_36_ = auVar70;
      auVar52 = vfmsub231ps_avx512vl(auVar69._0_32_,auVar59,auVar47);
      auVar74._0_4_ = auVar58._0_4_ * auVar47._0_4_;
      auVar74._4_4_ = auVar58._4_4_ * auVar47._4_4_;
      auVar74._8_4_ = auVar58._8_4_ * auVar47._8_4_;
      auVar74._12_4_ = auVar58._12_4_ * auVar47._12_4_;
      auVar74._16_4_ = auVar58._16_4_ * auVar47._16_4_;
      auVar74._20_4_ = auVar58._20_4_ * auVar47._20_4_;
      auVar74._24_4_ = auVar58._24_4_ * auVar47._24_4_;
      auVar74._28_36_ = auVar75;
      auVar92 = vfmsub231ps_fma(auVar74._0_32_,auVar65,auVar49);
      auVar55 = vsubps_avx512vl(auVar55,*(undefined1 (*) [32])ray);
      auVar56 = vsubps_avx512vl(auVar56,*(undefined1 (*) [32])(ray + 0x20));
      auVar57 = vsubps_avx512vl(auVar57,*(undefined1 (*) [32])(ray + 0x40));
      auVar46 = *(undefined1 (*) [32])(ray + 0x80);
      auVar48 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar51 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar60 = vmulps_avx512vl(auVar48,auVar57);
      auVar98 = vfmsub231ps_fma(auVar60,auVar56,auVar51);
      in_ZMM12 = ZEXT1664(auVar98);
      auVar107._0_4_ = auVar51._0_4_ * auVar55._0_4_;
      auVar107._4_4_ = auVar51._4_4_ * auVar55._4_4_;
      auVar107._8_4_ = auVar51._8_4_ * auVar55._8_4_;
      auVar107._12_4_ = auVar51._12_4_ * auVar55._12_4_;
      auVar107._16_4_ = auVar51._16_4_ * auVar55._16_4_;
      auVar107._20_4_ = auVar51._20_4_ * auVar55._20_4_;
      auVar107._28_36_ = in_ZMM13._28_36_;
      auVar107._24_4_ = auVar51._24_4_ * auVar55._24_4_;
      auVar16 = vfmsub231ps_fma(auVar107._0_32_,auVar57,auVar46);
      in_ZMM13 = ZEXT1664(auVar16);
      auVar109._0_4_ = auVar46._0_4_ * auVar56._0_4_;
      auVar109._4_4_ = auVar46._4_4_ * auVar56._4_4_;
      auVar109._8_4_ = auVar46._8_4_ * auVar56._8_4_;
      auVar109._12_4_ = auVar46._12_4_ * auVar56._12_4_;
      auVar109._16_4_ = auVar46._16_4_ * auVar56._16_4_;
      auVar109._20_4_ = auVar46._20_4_ * auVar56._20_4_;
      auVar109._28_36_ = in_ZMM14._28_36_;
      auVar109._24_4_ = auVar46._24_4_ * auVar56._24_4_;
      auVar53 = vfmsub231ps_avx512vl(auVar109._0_32_,auVar55,auVar48);
      in_ZMM14 = ZEXT3264(auVar53);
      auVar60._4_4_ = auVar51._4_4_ * auVar92._4_4_;
      auVar60._0_4_ = auVar51._0_4_ * auVar92._0_4_;
      auVar60._8_4_ = auVar51._8_4_ * auVar92._8_4_;
      auVar60._12_4_ = auVar51._12_4_ * auVar92._12_4_;
      auVar60._16_4_ = auVar51._16_4_ * 0.0;
      auVar60._20_4_ = auVar51._20_4_ * 0.0;
      auVar60._24_4_ = auVar51._24_4_ * 0.0;
      auVar60._28_4_ = auVar51._28_4_;
      auVar48 = vfmadd231ps_avx512vl(auVar60,auVar52,auVar48);
      auVar44 = vfmadd231ps_fma(auVar48,ZEXT1632(auVar45),auVar46);
      vandps_avx512vl(ZEXT1632(auVar44),auVar114._0_32_);
      auVar46 = vmulps_avx512vl(auVar59,auVar53);
      auVar46 = vfmadd231ps_avx512vl(auVar46,ZEXT1632(auVar16),auVar58);
      auVar46 = vfmadd231ps_avx512vl(auVar46,ZEXT1632(auVar98),auVar65);
      auVar46 = vxorps_avx512vl(auVar48,auVar46);
      uVar13 = vcmpps_avx512vl(auVar46,auVar115._0_32_,5);
      bVar31 = (byte)uVar13 & bVar32;
      if (bVar31 != 0) {
        auVar54._4_4_ = auVar50._4_4_ * auVar53._4_4_;
        auVar54._0_4_ = auVar50._0_4_ * auVar53._0_4_;
        auVar54._8_4_ = auVar50._8_4_ * auVar53._8_4_;
        auVar54._12_4_ = auVar50._12_4_ * auVar53._12_4_;
        auVar54._16_4_ = auVar50._16_4_ * auVar53._16_4_;
        auVar54._20_4_ = auVar50._20_4_ * auVar53._20_4_;
        auVar54._24_4_ = auVar50._24_4_ * auVar53._24_4_;
        auVar54._28_4_ = auVar50._28_4_;
        auVar17 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar16),auVar54);
        auVar17 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar98),ZEXT1632(auVar17));
        auVar90._0_4_ = (float)(auVar48._0_4_ ^ auVar17._0_4_);
        auVar90._4_4_ = (float)(auVar48._4_4_ ^ auVar17._4_4_);
        auVar90._8_4_ = (float)(auVar48._8_4_ ^ auVar17._8_4_);
        auVar90._12_4_ = (float)(auVar48._12_4_ ^ auVar17._12_4_);
        fVar66 = auVar48._16_4_;
        auVar90._16_4_ = fVar66;
        fVar89 = auVar48._20_4_;
        auVar90._20_4_ = fVar89;
        fVar72 = auVar48._24_4_;
        auVar90._24_4_ = fVar72;
        uVar36 = auVar48._28_4_;
        auVar90._28_4_ = uVar36;
        uVar13 = vcmpps_avx512vl(auVar90,auVar115._0_32_,5);
        bVar31 = bVar31 & (byte)uVar13;
        if (bVar31 != 0) {
          vandps_avx512vl(ZEXT1632(auVar44),auVar111._0_32_);
          auVar51 = vsubps_avx(auVar46,auVar46);
          uVar13 = vcmpps_avx512vl(auVar51,auVar90,5);
          bVar31 = bVar31 & (byte)uVar13;
          if (bVar31 != 0) {
            auVar22._4_4_ = auVar57._4_4_ * auVar92._4_4_;
            auVar22._0_4_ = auVar57._0_4_ * auVar92._0_4_;
            auVar22._8_4_ = auVar57._8_4_ * auVar92._8_4_;
            auVar22._12_4_ = auVar57._12_4_ * auVar92._12_4_;
            auVar22._16_4_ = auVar57._16_4_ * 0.0;
            auVar22._20_4_ = auVar57._20_4_ * 0.0;
            auVar22._24_4_ = auVar57._24_4_ * 0.0;
            auVar22._28_4_ = auVar57._28_4_;
            auVar17 = vfmadd213ps_fma(auVar56,auVar52,auVar22);
            auVar17 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar45),ZEXT1632(auVar17));
            auVar88._0_4_ = auVar48._0_4_ ^ auVar17._0_4_;
            auVar88._4_4_ = auVar48._4_4_ ^ auVar17._4_4_;
            auVar88._8_4_ = auVar48._8_4_ ^ auVar17._8_4_;
            auVar88._12_4_ = auVar48._12_4_ ^ auVar17._12_4_;
            auVar88._16_4_ = fVar66;
            auVar88._20_4_ = fVar89;
            auVar88._24_4_ = fVar72;
            auVar88._28_4_ = uVar36;
            fVar67 = auVar46._0_4_;
            auVar96._0_4_ = fVar67 * *(float *)(ray + 0x60);
            fVar78 = auVar46._4_4_;
            auVar96._4_4_ = fVar78 * *(float *)(ray + 100);
            fVar79 = auVar46._8_4_;
            auVar96._8_4_ = fVar79 * *(float *)(ray + 0x68);
            fVar80 = auVar46._12_4_;
            auVar96._12_4_ = fVar80 * *(float *)(ray + 0x6c);
            fVar81 = auVar46._16_4_;
            auVar96._16_4_ = fVar81 * *(float *)(ray + 0x70);
            fVar82 = auVar46._20_4_;
            auVar96._20_4_ = fVar82 * *(float *)(ray + 0x74);
            fVar83 = auVar46._24_4_;
            auVar96._24_4_ = fVar83 * *(float *)(ray + 0x78);
            auVar96._28_4_ = 0;
            pRVar1 = ray + 0x100;
            auVar29 = *(undefined1 (*) [28])pRVar1;
            iVar30 = *(int *)(ray + 0x11c);
            auVar48 = *(undefined1 (*) [32])pRVar1;
            auVar23._4_4_ = *(float *)(ray + 0x104) * fVar78;
            auVar23._0_4_ = *(float *)pRVar1 * fVar67;
            auVar23._8_4_ = *(float *)(ray + 0x108) * fVar79;
            auVar23._12_4_ = *(float *)(ray + 0x10c) * fVar80;
            auVar23._16_4_ = *(float *)(ray + 0x110) * fVar81;
            auVar23._20_4_ = *(float *)(ray + 0x114) * fVar82;
            auVar23._24_4_ = *(float *)(ray + 0x118) * fVar83;
            auVar23._28_4_ = iVar30;
            uVar13 = vcmpps_avx512vl(auVar88,auVar23,2);
            uVar14 = vcmpps_avx512vl(auVar96,auVar88,1);
            bVar31 = bVar31 & (byte)uVar13 & (byte)uVar14;
            local_2ae0 = auVar48;
            if (bVar31 != 0) {
              uVar13 = vcmpps_avx512vl(ZEXT1632(auVar44),ZEXT832(0) << 0x20,4);
              bVar31 = bVar31 & (byte)uVar13;
              if (bVar31 != 0) {
                pGVar3 = (context->scene->geometries).items[*(uint *)(lVar35 + uVar39 * 4)].ptr;
                local_2b00._0_8_ = pGVar3;
                uVar2 = pGVar3->mask;
                auVar97._4_4_ = uVar2;
                auVar97._0_4_ = uVar2;
                auVar97._8_4_ = uVar2;
                auVar97._12_4_ = uVar2;
                auVar97._16_4_ = uVar2;
                auVar97._20_4_ = uVar2;
                auVar97._24_4_ = uVar2;
                auVar97._28_4_ = uVar2;
                uVar13 = vptestmd_avx512vl(auVar97,*(undefined1 (*) [32])(ray + 0x120));
                bVar31 = bVar31 & (byte)uVar13;
                if (bVar31 != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar48 = vrcp14ps_avx512vl(auVar46);
                    auVar100._8_4_ = 0x3f800000;
                    auVar100._0_8_ = 0x3f8000003f800000;
                    auVar100._12_4_ = 0x3f800000;
                    auVar100._16_4_ = 0x3f800000;
                    auVar100._20_4_ = 0x3f800000;
                    auVar100._24_4_ = 0x3f800000;
                    auVar100._28_4_ = 0x3f800000;
                    auVar44 = vfnmadd213ps_fma(auVar46,auVar48,auVar100);
                    auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar48,auVar48);
                    auVar24._4_4_ = auVar44._4_4_ * fVar78;
                    auVar24._0_4_ = auVar44._0_4_ * fVar67;
                    auVar24._8_4_ = auVar44._8_4_ * fVar79;
                    auVar24._12_4_ = auVar44._12_4_ * fVar80;
                    auVar24._16_4_ = fVar81 * 0.0;
                    auVar24._20_4_ = fVar82 * 0.0;
                    auVar24._24_4_ = fVar83 * 0.0;
                    auVar24._28_4_ = auVar46._28_4_;
                    auVar46 = vminps_avx(auVar24,auVar100);
                    auVar25._4_4_ = auVar44._4_4_ * auVar90._4_4_;
                    auVar25._0_4_ = auVar44._0_4_ * auVar90._0_4_;
                    auVar25._8_4_ = auVar44._8_4_ * auVar90._8_4_;
                    auVar25._12_4_ = auVar44._12_4_ * auVar90._12_4_;
                    auVar25._16_4_ = fVar66 * 0.0;
                    auVar25._20_4_ = fVar89 * 0.0;
                    auVar25._24_4_ = fVar72 * 0.0;
                    auVar25._28_4_ = uVar36;
                    auVar48 = vminps_avx(auVar25,auVar100);
                    local_2900 = vsubps_avx(auVar100,auVar46);
                    local_28e0 = vsubps_avx(auVar100,auVar48);
                    pRVar4 = context->user;
                    local_28a0 = vpbroadcastd_avx512vl();
                    local_28c0 = vpbroadcastd_avx512vl();
                    local_2960 = (RTCHitN  [32])ZEXT1632(auVar45);
                    local_2920 = ZEXT1632(auVar92);
                    auVar46 = vpcmpeqd_avx2((undefined1  [32])local_2960,
                                            (undefined1  [32])local_2960);
                    local_2b38[1] = auVar46;
                    *local_2b38 = auVar46;
                    local_2880 = pRVar4->instID[0];
                    local_2860 = pRVar4->instPrimID[0];
                    local_2ae0._0_4_ = auVar29._0_4_;
                    local_2ae0._4_4_ = auVar29._4_4_;
                    local_2ae0._8_4_ = auVar29._8_4_;
                    local_2ae0._12_4_ = auVar29._12_4_;
                    local_2ae0._16_4_ = auVar29._16_4_;
                    local_2ae0._20_4_ = auVar29._20_4_;
                    local_2ae0._24_4_ = auVar29._24_4_;
                    auVar46 = vmulps_avx512vl(ZEXT1632(auVar44),auVar88);
                    bVar41 = (bool)(bVar31 >> 1 & 1);
                    bVar6 = (bool)(bVar31 >> 2 & 1);
                    bVar7 = (bool)(bVar31 >> 3 & 1);
                    bVar8 = (bool)(bVar31 >> 4 & 1);
                    bVar9 = (bool)(bVar31 >> 5 & 1);
                    bVar10 = (bool)(bVar31 >> 6 & 1);
                    *(uint *)(ray + 0x100) =
                         (uint)(bVar31 & 1) * auVar46._0_4_ |
                         (uint)!(bool)(bVar31 & 1) * local_2ae0._0_4_;
                    *(uint *)(ray + 0x104) =
                         (uint)bVar41 * auVar46._4_4_ | (uint)!bVar41 * local_2ae0._4_4_;
                    *(uint *)(ray + 0x108) =
                         (uint)bVar6 * auVar46._8_4_ | (uint)!bVar6 * local_2ae0._8_4_;
                    *(uint *)(ray + 0x10c) =
                         (uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * local_2ae0._12_4_;
                    *(uint *)(ray + 0x110) =
                         (uint)bVar8 * auVar46._16_4_ | (uint)!bVar8 * local_2ae0._16_4_;
                    *(uint *)(ray + 0x114) =
                         (uint)bVar9 * auVar46._20_4_ | (uint)!bVar9 * local_2ae0._20_4_;
                    *(uint *)(ray + 0x118) =
                         (uint)bVar10 * auVar46._24_4_ | (uint)!bVar10 * local_2ae0._24_4_;
                    *(uint *)(ray + 0x11c) =
                         (uint)(bVar31 >> 7) * auVar46._28_4_ | (uint)!(bool)(bVar31 >> 7) * iVar30;
                    local_2ac0 = vpmovm2d_avx512vl((ulong)bVar31);
                    local_2b30.valid = (int *)local_2ac0;
                    local_2b30.geometryUserPtr = pGVar3->userPtr;
                    local_2b30.context = context->user;
                    local_2b30.hit = local_2960;
                    local_2b30.N = 8;
                    local_2b30.ray = (RTCRayN *)ray;
                    local_2940 = auVar52;
                    uStack_287c = local_2880;
                    uStack_2878 = local_2880;
                    uStack_2874 = local_2880;
                    uStack_2870 = local_2880;
                    uStack_286c = local_2880;
                    uStack_2868 = local_2880;
                    uStack_2864 = local_2880;
                    uStack_285c = local_2860;
                    uStack_2858 = local_2860;
                    uStack_2854 = local_2860;
                    uStack_2850 = local_2860;
                    uStack_284c = local_2860;
                    uStack_2848 = local_2860;
                    uStack_2844 = local_2860;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      in_ZMM12 = ZEXT1664(auVar98);
                      in_ZMM13 = ZEXT1664(auVar16);
                      in_ZMM14 = ZEXT1664(auVar53._0_16_);
                      (*pGVar3->occlusionFilterN)(&local_2b30);
                    }
                    if (local_2ac0 == (undefined1  [32])0x0) {
                      uVar38 = 0;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_2b00._0_8_ + 0x3e) & 0x40) != 0)))) {
                        in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                        in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                        (*p_Var5)(&local_2b30);
                      }
                      uVar38 = vptestmd_avx512vl(local_2ac0,local_2ac0);
                      auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar41 = (bool)((byte)uVar38 & 1);
                      bVar6 = (bool)((byte)(uVar38 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar38 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar38 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar38 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar38 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar38 >> 6) & 1);
                      bVar12 = SUB81(uVar38 >> 7,0);
                      *(uint *)(local_2b30.ray + 0x100) =
                           (uint)bVar41 * auVar46._0_4_ |
                           (uint)!bVar41 * *(int *)(local_2b30.ray + 0x100);
                      *(uint *)(local_2b30.ray + 0x104) =
                           (uint)bVar6 * auVar46._4_4_ |
                           (uint)!bVar6 * *(int *)(local_2b30.ray + 0x104);
                      *(uint *)(local_2b30.ray + 0x108) =
                           (uint)bVar7 * auVar46._8_4_ |
                           (uint)!bVar7 * *(int *)(local_2b30.ray + 0x108);
                      *(uint *)(local_2b30.ray + 0x10c) =
                           (uint)bVar8 * auVar46._12_4_ |
                           (uint)!bVar8 * *(int *)(local_2b30.ray + 0x10c);
                      *(uint *)(local_2b30.ray + 0x110) =
                           (uint)bVar9 * auVar46._16_4_ |
                           (uint)!bVar9 * *(int *)(local_2b30.ray + 0x110);
                      *(uint *)(local_2b30.ray + 0x114) =
                           (uint)bVar10 * auVar46._20_4_ |
                           (uint)!bVar10 * *(int *)(local_2b30.ray + 0x114);
                      *(uint *)(local_2b30.ray + 0x118) =
                           (uint)bVar11 * auVar46._24_4_ |
                           (uint)!bVar11 * *(int *)(local_2b30.ray + 0x118);
                      *(uint *)(local_2b30.ray + 0x11c) =
                           (uint)bVar12 * auVar46._28_4_ |
                           (uint)!bVar12 * *(int *)(local_2b30.ray + 0x11c);
                    }
                    bVar31 = (byte)uVar38;
                    auVar52._0_4_ =
                         (uint)(bVar31 & 1) * *(int *)local_2b48 |
                         (uint)!(bool)(bVar31 & 1) * local_2ae0._0_4_;
                    bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
                    auVar52._4_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 4) | (uint)!bVar41 * local_2ae0._4_4_;
                    bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
                    auVar52._8_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 8) | (uint)!bVar41 * local_2ae0._8_4_;
                    bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
                    auVar52._12_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 0xc) |
                         (uint)!bVar41 * local_2ae0._12_4_;
                    bVar41 = (bool)((byte)(uVar38 >> 4) & 1);
                    auVar52._16_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 0x10) |
                         (uint)!bVar41 * local_2ae0._16_4_;
                    bVar41 = (bool)((byte)(uVar38 >> 5) & 1);
                    auVar52._20_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 0x14) |
                         (uint)!bVar41 * local_2ae0._20_4_;
                    bVar41 = (bool)((byte)(uVar38 >> 6) & 1);
                    auVar52._24_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 0x18) |
                         (uint)!bVar41 * local_2ae0._24_4_;
                    bVar41 = (bool)((byte)(uVar38 >> 7) & 1);
                    auVar52._28_4_ =
                         (uint)bVar41 * *(int *)(local_2b48 + 0x1c) |
                         (uint)!bVar41 * local_2ae0._28_4_;
                    *(undefined1 (*) [32])local_2b48 = auVar52;
                  }
                  bVar32 = bVar32 & ~bVar31;
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar111 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  auVar112 = ZEXT3264(auVar46);
                  uVar42 = uVar42 & 0xffffffff;
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar113 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar114 = ZEXT3264(auVar46);
                  auVar43 = vxorps_avx512vl(auVar43,auVar43);
                  auVar115 = ZEXT1664(auVar43);
                  goto LAB_00703791;
                }
              }
            }
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar111 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar112 = ZEXT3264(auVar46);
            uVar42 = uVar42 & 0xffffffff;
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar113 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar114 = ZEXT3264(auVar46);
            auVar43 = vxorps_avx512vl(auVar43,auVar43);
            auVar115 = ZEXT1664(auVar43);
          }
        }
      }
LAB_00703791:
      if ((bVar32 == 0) || (bVar41 = 2 < uVar39, uVar39 = uVar39 + 1, bVar41)) break;
    }
    bVar34 = bVar34 & bVar32;
    if (bVar34 == 0) break;
  }
  bVar34 = ~bVar34;
  uVar38 = local_2b40;
LAB_00703f96:
  bVar32 = (byte)uVar42;
  auVar46 = auVar112._0_32_;
  local_2b8c = local_2b8c | bVar34;
  if (local_2b8c == 0xff) {
    local_2b8c = 0xff;
    goto LAB_007040ef;
  }
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar41 = (bool)(local_2b8c >> 1 & 1);
  bVar6 = (bool)(local_2b8c >> 2 & 1);
  bVar7 = (bool)(local_2b8c >> 3 & 1);
  bVar8 = (bool)(local_2b8c >> 4 & 1);
  bVar9 = (bool)(local_2b8c >> 5 & 1);
  bVar10 = (bool)(local_2b8c >> 6 & 1);
  local_2640._4_4_ = (uint)bVar41 * auVar46._4_4_ | (uint)!bVar41 * local_2640._4_4_;
  local_2640._0_4_ =
       (uint)(local_2b8c & 1) * auVar46._0_4_ | (uint)!(bool)(local_2b8c & 1) * local_2640._0_4_;
  local_2640._8_4_ = (uint)bVar6 * auVar46._8_4_ | (uint)!bVar6 * local_2640._8_4_;
  local_2640._12_4_ = (uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * local_2640._12_4_;
  local_2640._16_4_ = (uint)bVar8 * auVar46._16_4_ | (uint)!bVar8 * local_2640._16_4_;
  local_2640._20_4_ = (uint)bVar9 * auVar46._20_4_ | (uint)!bVar9 * local_2640._20_4_;
  local_2640._24_4_ = (uint)bVar10 * auVar46._24_4_ | (uint)!bVar10 * local_2640._24_4_;
  local_2640._28_4_ =
       (uint)(local_2b8c >> 7) * auVar46._28_4_ | (uint)!(bool)(local_2b8c >> 7) * local_2640._28_4_
  ;
  goto LAB_0070330b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }